

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Node * __thiscall Parser::function(Node *__return_storage_ptr__,Parser *this)

{
  ifstream *fin;
  Lexer *this_00;
  pointer pcVar1;
  Node *this_01;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  ostream *poVar5;
  string funcName;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Node *local_98;
  key_type local_90;
  Node local_70;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  this_00 = &this->lexer;
  bVar2 = Lexer::isDataType(this_00);
  if (bVar2) {
    fin = &this->fin;
    Lexer::nextLexem(this_00,fin);
    if ((this->lexer).lexem.type == IDENTIFIER) {
      pcVar1 = (this->lexer).lexem.value._M_dataplus._M_p;
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar1,pcVar1 + (this->lexer).lexem.value._M_string_length);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
      iVar3 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar3 == 0) {
        pcVar1 = (this->lexer).lexem.value._M_dataplus._M_p;
        local_d8 = local_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar1,pcVar1 + (this->lexer).lexem.value._M_string_length);
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_d8);
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
      }
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->FUNCTIONS)._M_t,&local_90);
      local_98 = __return_storage_ptr__;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)cVar4._M_node == &(this->FUNCTIONS)._M_t._M_impl.super__Rb_tree_header)
      {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->FUNCTIONS,&local_b8);
        this_01 = local_98;
        Lexer::nextLexem(this_00,fin);
        if ((this->lexer).lexem.type == OPAR) {
          Lexer::nextLexem(this_00,fin);
          if ((this->lexer).lexem.type == CPAR) {
            Lexer::nextLexem(this_00,fin);
            Node::Node(this_01,FUNC,&local_b8);
            statement(&local_70,this);
            std::vector<Node,_std::allocator<Node>_>::push_back(&this_01->subnodes,&local_70);
            std::vector<Node,_std::allocator<Node>_>::~vector(&local_70.subnodes);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70.value._M_dataplus._M_p != &local_70.value.field_2) {
              operator_delete(local_70.value._M_dataplus._M_p,
                              local_70.value.field_2._M_allocated_capacity + 1);
            }
            if (this->didFuncReturn != false) {
              this->didFuncReturn = false;
              Lexer::nextLexem(this_00,fin);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,
                                CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                         local_b8.field_2._M_local_buf[0]) + 1);
              }
              return this_01;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Function \"",10);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_b8._M_dataplus._M_p,
                                local_b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" must return statement!",0x18);
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\")\" expected",0xc);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\"(\" expected",0xc);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Function with that name already exists",0x26);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      goto LAB_001069fd;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unexpected unqualified-id \"",0x1b);
    local_d8 = local_c8;
    pcVar1 = (this->lexer).lexem.value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + (this->lexer).lexem.value._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_d8,local_d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unexpected unqualified-id \"",0x1b);
    local_d8 = local_c8;
    pcVar1 = (this->lexer).lexem.value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + (this->lexer).lexem.value._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_d8,local_d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::__cxx11::string::~string((string *)&local_d8);
LAB_001069fd:
  exit(0);
}

Assistant:

Node Parser::function() {
    std::string funcName;
    if (!isDataType()) {
        cout << "Unexpected unqualified-id \"" << getLexemValue() << "\"" << endl;
        exit(0);
    }
    nextLexem();
    if (getLexemType() != IDENTIFIER) {
        cout << "Unexpected unqualified-id \"" << getLexemValue() << "\"" << endl;
        exit(0);
    }
    funcName = getLexemValue();
    if (doesFunctionExist(funcName)) {
        cout << "Function with that name already exists" << endl;
        exit(0);
    }
    FUNCTIONS.insert(funcName);
//    for (auto i : FUNCTIONS) {
//        cout << i << endl;
//    }
//    FUNCTIONS[funcName] = 1;
    nextLexem();
    if (getLexemType() != OPAR) {
        cout << "\"(\" expected" << endl;
        exit(0);
    }
    nextLexem();
    if (getLexemType() != CPAR) {
        cout << "\")\" expected" << endl;
        exit(0);
    }
    nextLexem();
    Node funcNode = Node(FUNC, funcName);
    funcNode.addSubnode(statement());
    if (!didFuncReturn) {
        cout << "Function \"" << funcName << "\" must return statement!" << endl;
        exit(0);
    }
    didFuncReturn = false;
    nextLexem();
    return funcNode;
}